

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChannelEvent.cpp
# Opt level: O3

void __thiscall MIDI::ChannelEvent::debug(ChannelEvent *this)

{
  ostream *poVar1;
  long *plVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  char *pcVar6;
  
  switch(this->_command) {
  case '\0':
    plVar2 = &std::cout;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\tInvalid MIDI Channel Event",0x1b);
    goto LAB_00106fef;
  default:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\tUnknown MIDI Channel Event",0x1b);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
    std::ostream::put(-0x30);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\tCommand: 0x",0xd);
    *(uint *)(std::ofstream::close + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::ofstream::close + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\tChannel: ",0xb);
    *(uint *)(std::ofstream::close + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::ofstream::close + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
    plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,this->_channel);
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\tParam 1: 0x",0xd);
    *(uint *)(std::ofstream::close + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::ofstream::close + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
    plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,this->_param1);
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
    pcVar6 = "\t\tParam 2: 0x";
    lVar4 = 0xd;
    goto LAB_00106fc2;
  case '\b':
    pcVar6 = "\tEnd Note ";
    lVar4 = 10;
    goto LAB_00106dc0;
  case '\t':
    pcVar6 = "\tStart Note ";
    lVar4 = 0xc;
LAB_00106dc0:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,lVar4);
    *(uint *)(std::ofstream::close + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::ofstream::close + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
    plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,this->_param1);
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
    pcVar6 = "\t\tVelocity: ";
    lVar4 = 0xc;
    break;
  case '\n':
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\tNote Aftertouch",0x10);
    *(uint *)(std::ofstream::close + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::ofstream::close + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
    plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,this->_param1);
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
    pcVar6 = "\t\tValue: ";
    lVar4 = 9;
    break;
  case '\v':
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\tController Event",0x11);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
    std::ostream::put(-0x30);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\tChannel: ",0xb);
    *(uint *)(std::ofstream::close + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::ofstream::close + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
    plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,this->_channel);
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\tType: 0x",10);
    *(uint *)(std::ofstream::close + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::ofstream::close + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
    plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,this->_param1);
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
    pcVar6 = "\t\tValue: 0x";
    lVar4 = 0xb;
LAB_00106fc2:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,lVar4);
    lVar4 = *(long *)(std::cout + -0x18);
    uVar3 = *(uint *)(std::ofstream::close + lVar4) & 0xffffffb5 | 8;
    goto LAB_00106fdc;
  case '\f':
    pcVar6 = "\tProgram Change to ";
    lVar4 = 0x13;
    goto LAB_00106cd3;
  case '\r':
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\tChannel Aftertouch",0x13);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
    std::ostream::put(-0x30);
    std::ostream::flush();
    pcVar6 = "\t\tValue: ";
    lVar4 = 9;
LAB_00106cd3:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,lVar4);
    *(uint *)(std::ofstream::close + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::ofstream::close + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
    iVar5 = this->_param1;
    goto LAB_00106fe4;
  case '\x0e':
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\tPitch Bend",0xb);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
    std::ostream::put(-0x30);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\t\tPitch Value (MSB): ",0x15);
    *(uint *)(std::ofstream::close + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::ofstream::close + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
    plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,this->_param1);
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
    pcVar6 = "\t\tPitch Value (LSB): ";
    lVar4 = 0x15;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,lVar4);
  lVar4 = *(long *)(std::cout + -0x18);
  uVar3 = *(uint *)(std::ofstream::close + lVar4) & 0xffffffb5 | 2;
LAB_00106fdc:
  *(uint *)(std::ofstream::close + lVar4) = uVar3;
  iVar5 = this->_param2;
LAB_00106fe4:
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar5);
LAB_00106fef:
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  return;
}

Assistant:

void ChannelEvent::debug()
  {
    switch(_command)
      {
      case MIDI_CHEVENT_INVALID:
	cout << "\tInvalid MIDI Channel Event" << endl;
	break;
      case MIDI_CHEVENT_NOTEOFF:
	cout << "\tEnd Note " << setbase(10) << _param1 << endl;
	cout << "\t\tVelocity: " << setbase(10) << _param2 << endl;
	break;
      case MIDI_CHEVENT_NOTEON:
	cout << "\tStart Note " << setbase(10) << _param1 << endl;
	cout << "\t\tVelocity: " << setbase(10) << _param2 << endl;
	break;
      case MIDI_CHEVENT_NOTEAFTERTOUCH:
	cout << "\tNote Aftertouch" << setbase(10) << _param1 << endl;
	cout << "\t\tValue: " << setbase(10) << _param2 << endl;
	break;
      case MIDI_CHEVENT_CONTROLLER:
	cout << "\tController Event" << endl;
	cout << "\t\tChannel: " << setbase(10) << _channel << endl;
	cout << "\t\tType: 0x" << setbase(16) << _param1 << endl;
	cout << "\t\tValue: 0x" << setbase(16) << _param2 << endl;
	break;
      case MIDI_CHEVENT_PROGRAMCHANGE:
	cout << "\tProgram Change to " << setbase(10) << _param1 << endl;
	break;
      case MIDI_CHEVENT_CHANNELAFTERTOUCH:
	cout << "\tChannel Aftertouch" << endl;
	cout << "\t\tValue: " << setbase(10) << _param1 << endl;
	break;
      case MIDI_CHEVENT_PITCHBEND:
	cout << "\tPitch Bend" << endl;
	cout << "\t\tPitch Value (MSB): " << setbase(10) << _param1 << endl;
	cout << "\t\tPitch Value (LSB): " << setbase(10) << _param2 << endl;
	break;
      default:
	cout << "\tUnknown MIDI Channel Event" << endl;
	cout << "\t\tCommand: 0x" << setbase(16) << (unsigned int)_command << endl;
	cout << "\t\tChannel: " << setbase(10) << _channel << endl;
	cout << "\t\tParam 1: 0x" << setbase(16) << _param1 << endl;
	cout << "\t\tParam 2: 0x" << setbase(16) << _param2 << endl;
	break;
      }   
  }